

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staleblock_test.cc
# Opt level: O2

void snapshot_after_block_reuse_test(void)

{
  FILE *pFVar1;
  fdb_kvs_handle *handle;
  fdb_status fVar2;
  size_t keylen;
  char *pcVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *snap_db;
  fdb_kvs_config kvs_config;
  char keybuf [16];
  timeval __test_begin;
  fdb_file_info file_info;
  fdb_config fconfig;
  
  memleak_start();
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  system("rm -rf  staleblktest* > errorlog.txt");
  fconfig.compaction_threshold = '\0';
  fconfig.num_keeping_headers = 5;
  fVar2 = fdb_open(&dbfile,"./staleblktest1",&fconfig);
  pFVar1 = _stderr;
  if (fVar2 != FDB_RESULT_SUCCESS) {
    pcVar3 = fdb_error_msg(fVar2);
    fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar2,pcVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x27f);
    snapshot_after_block_reuse_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x27f,"void snapshot_after_block_reuse_test()");
  }
  fVar2 = fdb_kvs_open(dbfile,&db,"num_keep",&kvs_config);
  pFVar1 = _stderr;
  if (fVar2 != FDB_RESULT_SUCCESS) {
    pcVar3 = fdb_error_msg(fVar2);
    fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar2,pcVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x281);
    snapshot_after_block_reuse_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x281,"void snapshot_after_block_reuse_test()");
  }
  uVar4 = 0;
  do {
    fVar2 = fdb_set_kv(db,"key",4,"val",4);
    pFVar1 = _stderr;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pcVar3 = fdb_error_msg(fVar2);
      fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar2,pcVar3,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x28a);
      snapshot_after_block_reuse_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x28a,"void snapshot_after_block_reuse_test()");
    }
    fVar2 = fdb_get_file_info(dbfile,&file_info);
    pFVar1 = _stderr;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pcVar3 = fdb_error_msg(fVar2);
      fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar2,pcVar3,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x28d);
      snapshot_after_block_reuse_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x28d,"void snapshot_after_block_reuse_test()");
    }
    uVar4 = uVar4 - 1;
  } while (file_info.file_size < 0x1000001);
  fVar2 = fdb_commit(dbfile,'\x01');
  pFVar1 = _stderr;
  if (fVar2 != FDB_RESULT_SUCCESS) {
    pcVar3 = fdb_error_msg(fVar2);
    fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar2,pcVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x292);
    snapshot_after_block_reuse_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x292,"void snapshot_after_block_reuse_test()");
  }
  uVar5 = 0;
  while (uVar5 != 10) {
    sprintf(keybuf,"key%d",(ulong)uVar5);
    handle = db;
    keylen = strlen(keybuf);
    fVar2 = fdb_set_kv(handle,keybuf,keylen,"reu",4);
    pFVar1 = _stderr;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pcVar3 = fdb_error_msg(fVar2);
      fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar2,pcVar3,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x299);
      snapshot_after_block_reuse_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x299,"void snapshot_after_block_reuse_test()");
    }
    fVar2 = fdb_commit(dbfile,'\x01');
    pFVar1 = _stderr;
    uVar5 = uVar5 + 1;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pcVar3 = fdb_error_msg(fVar2);
      fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar2,pcVar3,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x29b);
      snapshot_after_block_reuse_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x29b,"void snapshot_after_block_reuse_test()");
    }
  }
  uVar6 = uVar4 & 0xffffffff;
  while (uVar5 = (int)uVar6 + 1, uVar6 = (ulong)uVar5, uVar5 != 0) {
    fVar2 = fdb_set_kv(db,"key",4,"val",4);
    pFVar1 = _stderr;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pcVar3 = fdb_error_msg(fVar2);
      fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar2,pcVar3,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x2a2);
      snapshot_after_block_reuse_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x2a2,"void snapshot_after_block_reuse_test()");
    }
  }
  fVar2 = fdb_commit(dbfile,'\x01');
  pFVar1 = _stderr;
  if (fVar2 != FDB_RESULT_SUCCESS) {
    pcVar3 = fdb_error_msg(fVar2);
    fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar2,pcVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x2a5);
    snapshot_after_block_reuse_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x2a5,"void snapshot_after_block_reuse_test()");
  }
  fVar2 = fdb_snapshot_open(db,&snap_db,6 - uVar4);
  pFVar1 = _stderr;
  if (fVar2 != FDB_RESULT_SUCCESS) {
    pcVar3 = fdb_error_msg(fVar2);
    fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar2,pcVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x2aa);
    snapshot_after_block_reuse_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x2aa,"void snapshot_after_block_reuse_test()");
  }
  fVar2 = fdb_kvs_close(snap_db);
  pFVar1 = _stderr;
  if (fVar2 != FDB_RESULT_SUCCESS) {
    pcVar3 = fdb_error_msg(fVar2);
    fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar2,pcVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x2ac);
    snapshot_after_block_reuse_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x2ac,"void snapshot_after_block_reuse_test()");
  }
  fVar2 = fdb_snapshot_open(db,&snap_db,5 - uVar4);
  if (fVar2 != FDB_RESULT_NO_DB_INSTANCE) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x2b0);
    snapshot_after_block_reuse_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_NO_DB_INSTANCE",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x2b0,"void snapshot_after_block_reuse_test()");
  }
  fVar2 = fdb_kvs_close(db);
  pFVar1 = _stderr;
  if (fVar2 != FDB_RESULT_SUCCESS) {
    pcVar3 = fdb_error_msg(fVar2);
    fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar2,pcVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x2b3);
    snapshot_after_block_reuse_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x2b3,"void snapshot_after_block_reuse_test()");
  }
  fVar2 = fdb_close(dbfile);
  pFVar1 = _stderr;
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fdb_shutdown();
    memleak_end();
    pcVar3 = "%s PASSED\n";
    if (snapshot_after_block_reuse_test()::__test_pass != '\0') {
      pcVar3 = "%s FAILED\n";
    }
    fprintf(_stderr,pcVar3,"snapshot after block reuse test");
    return;
  }
  pcVar3 = fdb_error_msg(fVar2);
  fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar2,pcVar3,
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
          ,0x2b5);
  snapshot_after_block_reuse_test()::__test_pass = 1;
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                ,0x2b5,"void snapshot_after_block_reuse_test()");
}

Assistant:

void snapshot_after_block_reuse_test() {
    memleak_start();
    TEST_INIT();

    int i, r;
    int low_seq = 0;
    int nheaders=5;
    char keybuf[16];

    fdb_file_handle* dbfile;
    fdb_kvs_handle* db;
    fdb_kvs_handle* snap_db;
    fdb_status status;
    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fdb_file_info file_info;

    r = system(SHELL_DEL" staleblktest* > errorlog.txt");
    (void)r;

    // init
    fconfig.compaction_threshold = 0;
    fconfig.num_keeping_headers = nheaders;
    status = fdb_open(&dbfile, "./staleblktest1", &fconfig);
    TEST_STATUS(status);
    status = fdb_kvs_open(dbfile, &db, "num_keep", &kvs_config);
    TEST_STATUS(status);

    const char *key = "key";
    const char *val = "val";

    // load until exceeding SB_MIN_BLOCK_REUSING_FILESIZE
    i = 0;
    do {
        status = fdb_set_kv(db, key, strlen(key) + 1, val, strlen(val) + 1);
        TEST_STATUS(status);
        i++;
        status = fdb_get_file_info(dbfile, &file_info);
        TEST_STATUS(status);
    } while (file_info.file_size <= SB_MIN_BLOCK_REUSING_FILESIZE);

    // create lowest commit
    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_STATUS(status);
    low_seq = i;

    // create nheaders
    for (i = 0; i < nheaders + 5; ++i) {
        sprintf(keybuf, "key%d", i);
        status = fdb_set_kv(db, keybuf, strlen(keybuf), (char *)"reu", 4);
        TEST_STATUS(status);
        status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_STATUS(status);
    }

    // make sure all blocks up to kept headers are reused
    i = low_seq;
    while (--i) {
        status = fdb_set_kv(db, key, strlen(key) + 1, val, strlen(val) + 1);
        TEST_STATUS(status);
    }
    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_STATUS(status);

    // open snapshot on lowest seqno available
    low_seq += 6;
    status = fdb_snapshot_open(db, &snap_db, low_seq);
    TEST_STATUS(status);
    status = fdb_kvs_close(snap_db);
    TEST_STATUS(status);

    // open snapshot using seqno already reclaimed
    status = fdb_snapshot_open(db, &snap_db, low_seq-1);
    TEST_CHK(status == FDB_RESULT_NO_DB_INSTANCE);

    status = fdb_kvs_close(db);
    TEST_STATUS(status);
    status = fdb_close(dbfile);
    TEST_STATUS(status);
    fdb_shutdown();

    memleak_end();
    TEST_RESULT("snapshot after block reuse test");
}